

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall kj::Promise<kj::OwnFd>::Promise(Promise<kj::OwnFd> *this,Exception *exception)

{
  Exception *params;
  Own<kj::_::ImmediateBrokenPromiseNode,_kj::_::PromiseDisposer> local_28;
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer> local_20 [8];
  Exception *local_18;
  Exception *exception_local;
  Promise<kj::OwnFd> *this_local;
  
  local_18 = exception;
  exception_local = (Exception *)this;
  params = mv<kj::Exception>(exception);
  kj::_::allocPromise<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((_ *)&local_28,params);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::Own<kj::_::ImmediateBrokenPromiseNode,void>
            (local_20,&local_28);
  kj::_::PromiseBase::PromiseBase(&this->super_PromiseBase,(OwnPromiseNode *)local_20);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_20);
  Own<kj::_::ImmediateBrokenPromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  return;
}

Assistant:

Promise<T>::Promise(kj::Exception&& exception)
    : PromiseBase(_::allocPromise<_::ImmediateBrokenPromiseNode>(kj::mv(exception))) {}